

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

void sexp_push_utf8_char(sexp ctx,int i,sexp port)

{
  byte bVar1;
  sexp psVar2;
  uint len;
  ulong uVar3;
  uchar ch [6];
  byte abStack_1f [7];
  
  len = sexp_utf8_char_byte_count(i);
  sexp_utf8_encode_char((uchar *)((long)abStack_1f + 1),len,i);
  if ((port->value).type.getters == (sexp)0x0) {
    for (uVar3 = (ulong)len; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
      bVar1 = abStack_1f[uVar3];
      psVar2 = (port->value).type.print;
      (port->value).type.print = (sexp)((long)&psVar2[-1].value + 0x60bf);
      *(byte *)(((port->value).bytecode.max_depth - 1) + (long)psVar2) = bVar1;
    }
  }
  else {
    for (uVar3 = (ulong)len; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
      ungetc((uint)abStack_1f[uVar3],(FILE *)(port->value).type.getters);
    }
  }
  return;
}

Assistant:

void sexp_push_utf8_char (sexp ctx, int i, sexp port) {
  unsigned char ch[6];
  int len = sexp_utf8_char_byte_count(i);
  sexp_utf8_encode_char(ch, len, i);
  if (sexp_port_stream(port))  {
    while (len>0)
      ungetc(ch[--len], sexp_port_stream(port));
  } else {
    while (len>0)
      sexp_port_buf(port)[--sexp_port_offset(port)] = ch[--len];
  }
}